

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RtAudio.cpp
# Opt level: O3

RtAudioErrorType __thiscall RtApiAlsa::abortStream(RtApiAlsa *this)

{
  ostringstream *poVar1;
  StreamMutex *__mutex;
  StreamState SVar2;
  undefined8 *puVar3;
  int iVar4;
  StreamMode SVar5;
  size_t sVar6;
  char *pcVar7;
  ostream *poVar8;
  char *pcVar9;
  RtAudioErrorType RVar10;
  RtAudioErrorType type;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  SVar2 = (this->super_RtApi).stream_.state;
  if (STREAM_STOPPED < SVar2) {
    if (SVar2 == STREAM_STOPPING) goto LAB_0010e7de;
    if (SVar2 != STREAM_RUNNING) goto LAB_0010e800;
    (this->super_RtApi).stream_.state = STREAM_STOPPED;
    __mutex = &(this->super_RtApi).stream_.mutex;
    pthread_mutex_lock((pthread_mutex_t *)__mutex);
    puVar3 = (undefined8 *)(this->super_RtApi).stream_.apiHandle;
    SVar5 = (this->super_RtApi).stream_.mode;
    if ((SVar5 & ~DUPLEX) == OUTPUT) {
      iVar4 = snd_pcm_drop(*puVar3);
      if (-1 < iVar4) {
        SVar5 = (this->super_RtApi).stream_.mode;
        goto LAB_0010e7ae;
      }
      poVar8 = (ostream *)&(this->super_RtApi).errorStream_;
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar8,"RtApiAlsa::abortStream: error aborting output pcm device, ",0x3a);
      pcVar7 = (char *)snd_strerror(iVar4);
      if (pcVar7 == (char *)0x0) {
        std::ios::clear((int)poVar8 + (int)*(undefined8 *)(*(long *)poVar8 + -0x18));
      }
      else {
        sVar6 = strlen(pcVar7);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,pcVar7,sVar6);
      }
    }
    else {
LAB_0010e7ae:
      if (((1 < (uint)(SVar5 + ~OUTPUT)) || (*(char *)(puVar3 + 2) != '\0')) ||
         (iVar4 = snd_pcm_drop(puVar3[1]), -1 < iVar4)) {
        *(undefined1 *)(puVar3 + 9) = 0;
        pthread_mutex_unlock((pthread_mutex_t *)__mutex);
        return RTAUDIO_NO_ERROR;
      }
      poVar1 = &(this->super_RtApi).errorStream_;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,"RtApiAlsa::abortStream: error aborting input pcm device, ",0x39)
      ;
      pcVar7 = (char *)snd_strerror(iVar4);
      poVar8 = std::operator<<((ostream *)poVar1,pcVar7);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,".",1);
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::operator=((string *)&(this->super_RtApi).errorText_,(string *)local_50);
    if (local_50[0] != local_40) {
      operator_delete(local_50[0]);
    }
    *(undefined1 *)(puVar3 + 9) = 0;
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    RVar10 = RTAUDIO_SYSTEM_ERROR;
    type = RTAUDIO_SYSTEM_ERROR;
    goto LAB_0010e80d;
  }
  if (SVar2 == STREAM_CLOSED) {
LAB_0010e7de:
    pcVar7 = (char *)(this->super_RtApi).errorText_._M_string_length;
    pcVar9 = "RtApiAlsa::abortStream(): the stream is stopping or closed!";
LAB_0010e7f9:
    std::__cxx11::string::_M_replace((ulong)&(this->super_RtApi).errorText_,0,pcVar7,(ulong)pcVar9);
  }
  else if (SVar2 == STREAM_STOPPED) {
    pcVar7 = (char *)(this->super_RtApi).errorText_._M_string_length;
    pcVar9 = "RtApiAlsa::abortStream(): the stream is already stopped!";
    goto LAB_0010e7f9;
  }
LAB_0010e800:
  RVar10 = RTAUDIO_WARNING;
  type = RTAUDIO_WARNING;
LAB_0010e80d:
  RtApi::error(&this->super_RtApi,type);
  return RVar10;
}

Assistant:

RtAudioErrorType RtApiAlsa :: abortStream()
{
  if ( stream_.state != STREAM_RUNNING ) {
    if ( stream_.state == STREAM_STOPPED )
      errorText_ = "RtApiAlsa::abortStream(): the stream is already stopped!";
    else if ( stream_.state == STREAM_STOPPING || stream_.state == STREAM_CLOSED )
      errorText_ = "RtApiAlsa::abortStream(): the stream is stopping or closed!";
    return error( RTAUDIO_WARNING );
  }

  stream_.state = STREAM_STOPPED;
  MUTEX_LOCK( &stream_.mutex );

  int result = 0;
  AlsaHandle *apiInfo = (AlsaHandle *) stream_.apiHandle;
  snd_pcm_t **handle = (snd_pcm_t **) apiInfo->handles;
  if ( stream_.mode == OUTPUT || stream_.mode == DUPLEX ) {
    result = snd_pcm_drop( handle[0] );
    if ( result < 0 ) {
      errorStream_ << "RtApiAlsa::abortStream: error aborting output pcm device, " << snd_strerror( result ) << ".";
      errorText_ = errorStream_.str();
      goto unlock;
    }
  }

  if ( ( stream_.mode == INPUT || stream_.mode == DUPLEX ) && !apiInfo->synchronized ) {
    result = snd_pcm_drop( handle[1] );
    if ( result < 0 ) {
      errorStream_ << "RtApiAlsa::abortStream: error aborting input pcm device, " << snd_strerror( result ) << ".";
      errorText_ = errorStream_.str();
      goto unlock;
    }
  }

 unlock:
  apiInfo->runnable = false; // fixes high CPU usage when stopped
  MUTEX_UNLOCK( &stream_.mutex );

  if ( result < 0 ) return error( RTAUDIO_SYSTEM_ERROR );
  return RTAUDIO_NO_ERROR;
}